

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testNNValidatorBadOutput2(void)

{
  bool bVar1;
  ResultReason RVar2;
  ModelDescription *pMVar3;
  FeatureType *this;
  ostream *poVar4;
  Result local_a8;
  InnerProductLayerParams *innerProductParams;
  NeuralNetworkLayer *innerProductLayer;
  NeuralNetwork *nn;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *local_48;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar3 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  local_48 = CoreML::Specification::ModelDescription::add_input(pMVar3);
  CoreML::Specification::FeatureDescription::set_name(local_48,"input");
  this = CoreML::Specification::FeatureDescription::mutable_type(local_48);
  out = (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(this);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out,1);
  pMVar3 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  nn = (NeuralNetwork *)CoreML::Specification::ModelDescription::add_output(pMVar3);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)nn,"output");
  innerProductLayer =
       (NeuralNetworkLayer *)CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  innerProductParams =
       (InnerProductLayerParams *)
       CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)innerProductLayer);
  CoreML::Specification::NeuralNetworkLayer::add_input
            ((NeuralNetworkLayer *)innerProductParams,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output
            ((NeuralNetworkLayer *)innerProductParams,"output");
  local_a8.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct
                 ((NeuralNetworkLayer *)innerProductParams);
  CoreML::Specification::InnerProductLayerParams::set_hasbias
            ((InnerProductLayerParams *)local_a8.m_message._M_storage._M_storage,false);
  CoreML::validate<(MLModelType)500>(&local_a8,(Model *)&topIn);
  bVar1 = CoreML::Result::good(&local_a8);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa0);
    poVar4 = std::operator<<(poVar4,": error: ");
    poVar4 = std::operator<<(poVar4,"!(((res)).good())");
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    m1._oneof_case_[0] = 1;
  }
  else {
    RVar2 = CoreML::Result::reason(&local_a8);
    if (RVar2 == MODEL_OUTPUT_TYPE_INVALID) {
      m1._oneof_case_[0] = 0;
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa0);
      poVar4 = std::operator<<(poVar4,": error: ");
      poVar4 = std::operator<<(poVar4,
                               "((ResultReason::MODEL_OUTPUT_TYPE_INVALID)) == ((res).reason())");
      poVar4 = std::operator<<(poVar4," was false, expected true.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      m1._oneof_case_[0] = 1;
    }
  }
  CoreML::Result::~Result(&local_a8);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testNNValidatorBadOutput2() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");

    auto *nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();
    innerProductLayer->add_input("input");
    innerProductLayer->add_output("output");
    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();

    innerProductParams->set_hasbias(false);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD_WITH_REASON(res, ResultReason::MODEL_OUTPUT_TYPE_INVALID);

    return 0;
}